

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifsay(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  runcxdef *prVar2;
  runsdef *prVar3;
  char numbuf [30];
  char acStack_28 [32];
  
  prVar2 = ctx->bifcxrun;
  uVar1 = prVar2->runcxsp[-1].runstyp;
  prVar3 = prVar2->runcxsp + -1;
  if (uVar1 == '\x05') {
    prVar2->runcxsp = prVar3;
    if ((prVar3->runstyp != '\b') && (ctx->bifcxrun->runcxsp->runstyp != '\x05')) {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ed);
    }
  }
  else {
    if (uVar1 == '\x03') {
      prVar2->runcxsp = prVar3;
      if (prVar3->runstyp == '\x03') {
        outfmt(ctx->bifcxtio,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
        return;
      }
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ef);
    }
    if (uVar1 != '\x01') {
      prVar2->runcxerr->errcxptr->erraav[0].errastr = "say";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x3ff);
    }
    prVar2->runcxsp = prVar3;
    if (prVar3->runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    sprintf(acStack_28,"%ld",(ctx->bifcxrun->runcxsp->runsv).runsvnum);
    outformat(acStack_28);
  }
  return;
}

Assistant:

void bifsay(bifcxdef *ctx, int argc)
{
    uchar *str;
    long   num;
    char   numbuf[30];

    if (argc != 2) bifcntargs(ctx, 1, argc);
    
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NUMBER:
        num = runpopnum(ctx->bifcxrun);
        sprintf(numbuf, "%ld", num);
        tioputs(ctx->bifcxtio, numbuf);
        break;
        
    case DAT_SSTRING:
        str = runpopstr(ctx->bifcxrun);
        outfmt(ctx->bifcxtio, str);
        break;
        
    case DAT_NIL:
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "say");
    }
}